

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSIXEnvironment.h
# Opt level: O0

char ** __thiscall llbuild::basic::POSIXEnvironment::getEnvp(POSIXEnvironment *this)

{
  bool bVar1;
  char **ppcVar2;
  void *local_40;
  char *local_38;
  reference local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  POSIXEnvironment *this_local;
  
  this->isFrozen = true;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->env);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->envStorage);
  entry = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->envStorage);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&entry);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    local_38 = (char *)std::__cxx11::string::c_str();
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)this,&local_38);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  local_40 = (void *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<decltype(nullptr)>
            ((vector<char_const*,std::allocator<char_const*>> *)this,&local_40);
  ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data(&this->env);
  return ppcVar2;
}

Assistant:

const char* const* getEnvp() {
    isFrozen = true;

    // Form the final environment.
    env.clear();
    for (const auto& entry : envStorage) {
      env.emplace_back(entry.c_str());
    }
    env.emplace_back(nullptr);
    return env.data();
  }